

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.hpp
# Opt level: O3

void boost::python::detail::define_class_init_helper<0>::
     apply<boost::python::class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>,boost::python::default_call_policies,boost::mpl::vector3<HighFreqDataType,int,HFParsingInfo>,boost::mpl::size<boost::mpl::vector3<HighFreqDataType,int,HFParsingInfo>>>
               (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
                *cl,undefined8 policies,undefined8 param_3,char *param_4)

{
  undefined1 local_29;
  object local_28;
  char *local_20;
  
  local_20 = param_4;
  make_function_aux<void(*)(_object*,HighFreqDataType,int,HFParsingInfo),boost::python::default_call_policies,boost::mpl::vector5<void,_object*,HighFreqDataType,int,HFParsingInfo>,mpl_::int_<0>>
            (&local_28,
             objects::make_holder<3>::
             apply<boost::python::objects::value_holder<NeuralConsumer_python>,_boost::mpl::vector3<HighFreqDataType,_int,_HFParsingInfo>_>
             ::execute,policies,&local_29);
  class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<boost::python::api::object,char_const*>(cl,"__init__",&local_28,&local_20);
  *(long *)local_28.super_object_base.m_ptr = *(long *)local_28.super_object_base.m_ptr + -1;
  if (*(long *)local_28.super_object_base.m_ptr == 0) {
    _Py_Dealloc();
  }
  return;
}

Assistant:

static void apply(
          ClassT& cl
        , CallPoliciesT const& policies
        , Signature const& args
        , NArgs
        , char const* doc
        , detail::keyword_range const& keywords)
      {
          detail::def_init_aux(cl, args, NArgs(), policies, doc, keywords);
      }